

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

data_ptr_t
duckdb::StandardBufferManager::BufferAllocatorAllocate
          (PrivateAllocatorData *private_data,idx_t size)

{
  StandardBufferManager *this;
  Allocator *this_00;
  data_ptr_t pdVar1;
  idx_t in_RCX;
  TempBufferPoolReservation reservation;
  TempBufferPoolReservation local_58;
  string local_40;
  
  this = (StandardBufferManager *)private_data[1]._vptr_PrivateAllocatorData;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_40,(StringUtil *)size,0x400,in_RCX);
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&local_58,this,ALLOCATOR,size,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
             "failed to allocate data of size %s%s",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_58.super_BufferPoolReservation.size = 0;
  this_00 = Allocator::Get((DatabaseInstance *)private_data[1]._vptr_PrivateAllocatorData[1]);
  pdVar1 = Allocator::AllocateData(this_00,size);
  TempBufferPoolReservation::~TempBufferPoolReservation(&local_58);
  return pdVar1;
}

Assistant:

data_ptr_t StandardBufferManager::BufferAllocatorAllocate(PrivateAllocatorData *private_data, idx_t size) {
	auto &data = private_data->Cast<BufferAllocatorData>();
	auto reservation =
	    data.manager.EvictBlocksOrThrow(MemoryTag::ALLOCATOR, size, nullptr, "failed to allocate data of size %s%s",
	                                    StringUtil::BytesToHumanReadableString(size));
	// We rely on manual tracking of this one. :(
	reservation.size = 0;
	return Allocator::Get(data.manager.db).AllocateData(size);
}